

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::Tick(AActor *this)

{
  double *pdVar1;
  bool bVar2;
  BYTE BVar3;
  bool bVar4;
  unsigned_short uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  MetaClass *pMVar10;
  char *pcVar11;
  TVector2<double> *other;
  sector_t_conflict *psVar12;
  secplane_t *this_00;
  AActor *source;
  FState *newstate;
  double dVar13;
  double dVar14;
  int local_424;
  byte local_402;
  byte local_401;
  bool local_38a;
  TFlags<ActorFlag5,_unsigned_int> local_36c;
  int limit;
  TFlags<ActorFlag3,_unsigned_int> local_364;
  TFlags<ActorFlag5,_unsigned_int> local_360;
  int local_35c;
  int respawn_monsters;
  FName local_34c;
  TFlags<ActorBounceFlag,_unsigned_short> local_346;
  TFlags<ActorFlag,_unsigned_int> local_344;
  TFlags<ActorFlag3,_unsigned_int> local_340;
  TFlags<ActorFlag6,_unsigned_int> local_33c;
  double local_338;
  double deltaview;
  Self local_328;
  TFlags<ActorFlag,_unsigned_int> local_324;
  TFlags<ActorFlag2,_unsigned_int> local_320;
  TFlags<ActorFlag6,_unsigned_int> local_31c;
  Self local_318;
  TFlags<ActorFlag2,_unsigned_int> local_314;
  TVector2<double> local_310;
  double local_300;
  double oldfloorz;
  DVector3 local_2f0;
  undefined1 local_2d8 [40];
  TVector2<double> local_2b0;
  sector_t_conflict *local_2a0;
  sector_t *sec_1;
  msecnode_t *pmStack_290;
  bool dopush;
  msecnode_t *node_1;
  TVector2<double> local_270;
  DVector3 local_260;
  secplane_t local_248;
  undefined1 local_220 [8];
  secplane_t floorplane;
  TFlags<ActorFlag,_unsigned_int> local_1f0;
  TFlags<ActorFlag,_unsigned_int> local_1ec;
  TVector2<double> local_1e8;
  double local_1d8;
  double height2;
  undefined1 local_1c0 [8];
  DVector3 pos;
  sector_t *heightsec;
  TAngle<double> local_188;
  DAngle angle;
  double carryspeed_1;
  double dStack_170;
  int anglespeed;
  double carryspeed;
  undefined1 auStack_160 [3];
  BYTE dir;
  int scrolltype;
  DVector2 scrollv;
  sector_t *sec;
  int county;
  int countx;
  msecnode_t *node;
  double waterheight;
  double height;
  undefined1 local_120 [8];
  DVector2 cumm;
  TFlags<ActorFlag,_unsigned_int> local_108;
  TFlags<ActorFlag,_unsigned_int> local_104;
  Self local_100;
  TFlags<ActorFlag4,_unsigned_int> local_fc;
  double local_f8;
  double oldz;
  FName local_d4;
  AActor *local_d0;
  AActor *th_1;
  double zo;
  double yo;
  double xo;
  DAngle moveangle;
  DVector3 local_90;
  FName local_74;
  AActor *local_70;
  AActor *th;
  TFlags<ActorFlag5,_unsigned_int> local_60;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  AInventory *local_58;
  AInventory *item;
  undefined1 local_38 [8];
  FLinkContext ctx;
  TFlags<ActorFlag5,_unsigned_int> local_20;
  TFlags<ActorFlag5,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *onmo;
  AActor *this_local;
  
  onmo = this;
  if (this->state == (FState *)0x0) {
    pMVar10 = GetClass(this);
    pcVar11 = FName::GetChars(&(pMVar10->super_PClass).super_PNativeStruct.super_PStruct.
                               super_PNamedType.TypeName);
    dVar13 = X(this);
    Y(this);
    Printf("Actor of type %s at (%f,%f) left without a state\n",dVar13,pcVar11);
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
    return;
  }
  ClearInterpolation(this);
  iVar9 = (int)this;
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_1c,
             iVar9 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF))
  ;
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
  if (uVar6 != 0) {
    TFlags<ActorFlag5,_unsigned_int>::operator&
              (&local_20,
               iVar9 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF
                       ));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_20);
    if ((uVar6 == 0) && (((bglobal._16_1_ & 1) != 0 || ((::level.flags2 & 0x20) != 0)))) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                ((TFlags<ActorFlag6,_unsigned_int> *)((long)&ctx.render_list + 4),
                 iVar9 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&ctx.render_list + 4));
      if (uVar6 == 0) {
        return;
      }
      this->special2 = this->special2 + 1;
      return;
    }
    bVar2 = TVector3<double>::isZero(&this->Vel);
    bVar4 = true;
    if (bVar2) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&ctx.render_list,
                 iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&ctx.render_list);
      bVar4 = uVar6 == 0;
    }
    if (bVar4) {
      FLinkContext::FLinkContext((FLinkContext *)local_38);
      UnlinkFromWorld(this,(FLinkContext *)local_38);
      TFlags<ActorFlag,_unsigned_int>::operator|=(&this->flags,MF_NOBLOCKMAP);
      Vec3Offset((DVector3 *)&item,this,&this->Vel,false);
      SetXYZ(this,(DVector3 *)&item);
      CheckPortalTransition(this,false);
      LinkToWorld(this,(FLinkContext *)local_38,false,(sector_t *)0x0);
    }
    goto LAB_005b0959;
  }
  local_58 = ::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&this->Inventory);
  while( true ) {
    local_38a = false;
    if (local_58 != (AInventory *)0x0) {
      local_38a = TObjPtr<AActor>::operator==(&local_58->Owner,this);
    }
    if (local_38a == false) break;
    (*(local_58->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])();
    local_58 = ::TObjPtr::operator_cast_to_AInventory_
                         ((TObjPtr *)&(local_58->super_AActor).Inventory);
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_5c,
             iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
  if (uVar6 != 0) {
    return;
  }
  TFlags<ActorFlag5,_unsigned_int>::operator&
            (&local_60,
             iVar9 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF))
  ;
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
  if (uVar6 == 0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)((long)&th + 4),
               iVar9 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&th + 4));
    if (uVar6 != 0) {
      this->special2 = this->special2 + 1;
    }
    if ((bglobal._16_1_ & 1) != 0) {
      if (this->player == (player_t *)0x0) {
        return;
      }
      bVar4 = TObjPtr<DBot>::operator==(&this->player->Bot,(DBot *)0x0);
      if (!bVar4) {
        return;
      }
    }
    if ((::level.flags2 & 0x20) != 0) {
      if (this->player == (player_t *)0x0) {
        return;
      }
      if (this->player->timefreezer == 0) {
        return;
      }
    }
  }
  if ((this->effects & 1) == 0) {
    if (((this->effects & 2) != 0) &&
       (BVar3 = this->smokecounter + '\x01', this->smokecounter = BVar3, BVar3 == '\b')) {
      this->smokecounter = '\0';
      TVector3<double>::Angle((TVector3<double> *)&xo);
      dVar14 = TAngle<double>::Cos((TAngle<double> *)&xo);
      dVar13 = this->radius;
      iVar7 = FRandom::operator()(&pr_rockettrail);
      yo = -dVar14 * dVar13 * 2.0 + (double)iVar7 / 64.0;
      dVar14 = TAngle<double>::Sin((TAngle<double> *)&xo);
      dVar13 = this->radius;
      iVar7 = FRandom::operator()(&pr_rockettrail);
      zo = -dVar14 * dVar13 * 2.0 + (double)iVar7 / 64.0;
      th_1 = (AActor *)((-this->Height * (this->Vel).Z) / 8.0 + this->Height * 0.6666666666666666);
      FName::FName(&local_d4,"GrenadeSmokeTrail");
      Vec3Offset((DVector3 *)&oldz,this,yo,zo,(double)th_1,false);
      local_d0 = Spawn(&local_d4,(DVector3 *)&oldz,ALLOW_REPLACE);
      if (local_d0 != (AActor *)0x0) {
        uVar6 = FRandom::operator()(&pr_rockettrail);
        local_d0->tics = local_d0->tics - (uVar6 & 3);
        if (local_d0->tics < 1) {
          local_d0->tics = 1;
        }
        uVar6 = FIntCVar::operator_cast_to_int(&cl_rockettrails);
        if ((uVar6 & 2) == 0) {
          TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_d0->renderflags,RF_INVISIBLE);
        }
      }
    }
  }
  else {
    BVar3 = this->smokecounter + '\x01';
    this->smokecounter = BVar3;
    if (BVar3 == '\x04') {
      this->smokecounter = '\0';
      FName::FName(&local_74,"RocketSmokeTrail");
      TVector3<double>::operator-((TVector3<double> *)&moveangle,&this->Vel);
      Vec3Offset(&local_90,this,(DVector3 *)&moveangle,false);
      local_70 = Spawn(&local_74,&local_90,ALLOW_REPLACE);
      if (local_70 != (AActor *)0x0) {
        uVar6 = FRandom::operator()(&pr_rockettrail);
        local_70->tics = local_70->tics - (uVar6 & 3);
        if (local_70->tics < 1) {
          local_70->tics = 1;
        }
        uVar6 = FIntCVar::operator_cast_to_int(&cl_rockettrails);
        if ((uVar6 & 2) == 0) {
          TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_70->renderflags,RF_INVISIBLE);
        }
      }
    }
  }
  local_f8 = Z(this);
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_fc,iVar9 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
            );
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_fc);
  if ((uVar6 != 0) && (0 < this->health)) {
    if (0.25 <= ABS((this->Vel).Z)) {
      (this->Vel).Z = (this->Vel).Z * 0.90625;
    }
    else {
      (this->Vel).Z = 0.0;
      operator~((EnumType)&local_100);
      TFlags<ActorFlag4,_unsigned_int>::operator&=(&this->flags4,&local_100);
    }
  }
  if ((this->effects & 0x40) == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_104,
               iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
    if (uVar6 != 0) {
      (this->RenderStyle).field_0.Flags = (this->RenderStyle).field_0.Flags & 0xfd;
      if (this->visdir < '\x01') {
        if ((this->visdir < '\0') &&
           (this->Alpha = this->Alpha - 0.04285714285714286,
           this->Alpha <= 0.0 && this->Alpha != 0.0)) {
          this->Alpha = 0.0;
          this->visdir = '\0';
        }
      }
      else {
        this->Alpha = this->Alpha + 0.05714285714285714;
        if (1.0 < this->Alpha) {
          this->Alpha = 1.0;
          this->visdir = '\0';
        }
      }
    }
  }
  else if (this->visdir < '\x01') {
    this->Alpha = this->Alpha - 0.03125;
    if (this->Alpha <= 0.25) {
      this->Alpha = 0.25;
      this->visdir = '\x01';
    }
  }
  else {
    this->Alpha = this->Alpha + 0.03125;
    if (1.0 <= this->Alpha) {
      this->Alpha = 1.0;
      this->visdir = -1;
    }
  }
  bVar4 = false;
  if ((bglobal.botnum != 0) && (bVar4 = false, (demoplayback & 1U) == 0)) {
    ::operator|((int)&cumm + (MF_NOSECTOR|MF_SHOOTABLE),MF_SPECIAL);
    TFlags<ActorFlag,_unsigned_int>::operator&(&local_108,&this->flags);
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
    bVar4 = true;
    if (uVar6 == 0) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                ((TFlags<ActorFlag3,_unsigned_int> *)&cumm.Y,
                 iVar9 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&cumm.Y);
      bVar4 = uVar6 != 0;
    }
  }
  if (bVar4) {
    FCajunMaster::BotTick(&bglobal,this);
  }
  TVector2<double>::TVector2((TVector2<double> *)local_120,0.0,0.0);
  uVar6 = TArray<TVector2<double>,_TVector2<double>_>::Size(&::level.Scrolls);
  if ((uVar6 != 0) || (bVar4 = false, this->player != (player_t *)0x0)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&height + 4),
               iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&height + 4));
    bVar4 = false;
    if (uVar6 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&height,
                 iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&height);
      bVar4 = uVar6 == 0;
    }
  }
  if (bVar4) {
    sec._0_4_ = 0;
    sec._4_4_ = 0;
    for (_county = this->touching_sectorlist; _county != (msecnode_t *)0x0;
        _county = _county->m_tnext) {
      scrollv.Y = (double)_county->m_sector;
      TVector2<double>::TVector2((TVector2<double> *)auStack_160);
      uVar6 = TArray<TVector2<double>,_TVector2<double>_>::Size(&::level.Scrolls);
      if ((uint)(((long)scrollv.Y - (long)sectors) / 0x218) < uVar6) {
        other = TArray<TVector2<double>,_TVector2<double>_>::operator[]
                          (&::level.Scrolls,((long)scrollv.Y - (long)sectors) / 0x218);
        TVector2<double>::operator=((TVector2<double> *)auStack_160,other);
      }
      else {
        TVector2<double>::Zero((TVector2<double> *)auStack_160);
      }
      if (this->player != (player_t *)0x0) {
        iVar7 = (int)*(short *)((long)scrollv.Y + 0x110);
        if ((iVar7 < 0xc9) || (0xe0 < iVar7)) {
          if ((iVar7 < 0xe1) || (0xf4 < iVar7)) {
            if (iVar7 == 0x54) {
              if ((i_compatflags & 0x400U) == 0) {
                _auStack_160 = _auStack_160 + 4.0;
              }
              else {
                _auStack_160 = _auStack_160 + 9.333333333333334;
              }
            }
            else if (iVar7 == 0x76) {
              iVar7 = FTagManager::GetFirstSectorTag(&tagManager,(sector_t *)scrollv.Y);
              angle.Degrees = (double)((iVar7 + -100) % 10) / 1.5;
              TAngle<double>::TAngle(&local_188,(double)((iVar7 + -100) / 10) * 45.0);
              TAngle<double>::ToVector((TAngle<double> *)&heightsec,angle.Degrees);
              TVector2<double>::operator+=
                        ((TVector2<double> *)auStack_160,(TVector2<double> *)&heightsec);
            }
          }
          else {
            iVar7 = iVar7 + -0xe1;
            dStack_170 = (double)"\x05\n\x19\x1e#"[iVar7 % 5] * 0.3333333333333333;
            if ((iVar7 < 5) && ((i_compatflags & 0x400U) == 0)) {
              dStack_170 = (double)(1 << ((char)((long)iVar7 % 5) + 0xfU & 0x1f)) / 65536.0;
            }
            _auStack_160 = dStack_170 * (double)(int)(("\x06\t\x01\x04"[iVar7 / 5] & 3) - 1) +
                           _auStack_160;
            scrollv.X = dStack_170 * (double)(((int)("\x06\t\x01\x04"[iVar7 / 5] & 0xc) >> 2) + -1)
                        + scrollv.X;
          }
        }
        else {
          iVar7 = iVar7 + -0xc9;
          if ((i_compatflags & 0x400U) == 0) {
            dVar14 = (double)(int)Tick::HexenScrollies[iVar7][0] * 0.5;
            dVar13 = (double)(int)Tick::HexenScrollies[iVar7][1] * 0.5;
          }
          else {
            dVar14 = (double)(int)Tick::HexenCompatSpeeds[Tick::HexenScrollies[iVar7][0] + 4] *
                     0.3333333333333333;
            dVar13 = (double)(int)Tick::HexenCompatSpeeds[Tick::HexenScrollies[iVar7][1] + 4] *
                     0.3333333333333333;
          }
          scrollv.X = dVar13 + scrollv.X;
          _auStack_160 = _auStack_160 - dVar14;
        }
      }
      bVar4 = TVector2<double>::isZero((TVector2<double> *)auStack_160);
      if (!bVar4) {
        psVar12 = sector_t::GetHeightSec((sector_t *)scrollv.Y);
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)((long)&pos.Z + 4),
                   iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                           MF_SHOOTABLE));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&pos.Z + 4));
        if (uVar6 == 0 || psVar12 != (sector_t_conflict *)0x0) {
          PosRelative((DVector3 *)local_1c0,this,(sector_t *)scrollv.Y);
          this_00 = (secplane_t *)((long)scrollv.Y + 0xb0);
          TVector2<double>::TVector2((TVector2<double> *)&height2,(TVector3<double> *)local_1c0);
          dVar13 = secplane_t::ZatPoint(this_00,(DVector2 *)&height2);
          local_1d8 = secplane_t::ZatPoint((secplane_t *)((long)scrollv.Y + 0xb0),this);
          bVar4 = isAbove(this,dVar13);
          if (bVar4) {
            if (psVar12 != (sector_t_conflict *)0x0) {
              TVector2<double>::TVector2(&local_1e8,(TVector3<double> *)local_1c0);
              dVar14 = secplane_t::ZatPoint(&psVar12->floorplane,&local_1e8);
              if ((dVar14 <= dVar13) || (dVar13 = Z(this), dVar13 < dVar14)) goto LAB_005afb6b;
            }
          }
          else {
LAB_005afb6b:
            TVector2<double>::operator+=
                      ((TVector2<double> *)local_120,(TVector2<double> *)auStack_160);
            if ((_auStack_160 != 0.0) || (NAN(_auStack_160))) {
              sec._4_4_ = sec._4_4_ + 1;
            }
            if ((scrollv.X != 0.0) || (NAN(scrollv.X))) {
              sec._0_4_ = (int)sec + 1;
            }
          }
        }
      }
    }
    if ((this->player != (player_t *)0x0) || ((i_compatflags & 0x8000U) == 0)) {
      if (1 < sec._4_4_) {
        local_120 = (undefined1  [8])((double)local_120 / (double)sec._4_4_);
      }
      if (1 < (int)sec) {
        cumm.X = cumm.X / (double)(int)sec;
      }
    }
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_1ec,
             iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ec);
  bVar4 = false;
  if (uVar6 != 0) {
    ::operator|((int)&floorplane + (MF_AMBUSH|MF_SHOOTABLE),MF_NOCLIP);
    TFlags<ActorFlag,_unsigned_int>::operator&(&local_1f0,&this->flags);
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f0);
    bVar4 = false;
    if (uVar6 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)&floorplane.negiC,
                 iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&floorplane.negiC);
      bVar4 = false;
      if ((uVar6 == 0) && (bVar4 = false, (this->Vel).Z <= 0.0)) {
        dVar13 = this->floorz;
        dVar14 = Z(this);
        bVar4 = dVar13 == dVar14;
      }
    }
  }
  if (bVar4) {
    secplane_t::secplane_t((secplane_t *)local_220);
    psVar12 = (sector_t_conflict *)this->floorsector;
    PosAtZ(&local_260,this,this->floorz);
    P_FindFloorPlane(&local_248,psVar12,&local_260);
    secplane_t::operator=((secplane_t *)local_220,&local_248);
    dVar13 = secplane_t::fC((secplane_t *)local_220);
    bVar4 = false;
    if (dVar13 < 0.707122802734375) {
      PosRelative((DVector3 *)&node_1,this,this->floorsector);
      TVector2<double>::TVector2(&local_270,(TVector3<double> *)&node_1);
      dVar13 = secplane_t::ZatPoint((secplane_t *)local_220,&local_270);
      bVar4 = dVar13 <= this->floorz;
    }
    if (bVar4) {
      sec_1._7_1_ = 1;
      dVar13 = secplane_t::fC((secplane_t *)local_220);
      if (0.4714152018229167 < dVar13) {
        for (pmStack_290 = this->touching_sectorlist; pmStack_290 != (msecnode_t *)0x0;
            pmStack_290 = pmStack_290->m_tnext) {
          local_2a0 = pmStack_290->m_sector;
          dVar13 = secplane_t::fC(&local_2a0->floorplane);
          if (0.707122802734375 <= dVar13) {
            PosRelative((DVector3 *)(local_2d8 + 0x10),this,(sector_t *)pmStack_290->m_sector);
            TVector2<double>::TVector2(&local_2b0,(TVector3<double> *)(local_2d8 + 0x10));
            dVar13 = secplane_t::ZatPoint((secplane_t *)local_220,&local_2b0);
            dVar14 = Z(this);
            if (dVar14 - this->MaxStepHeight <= dVar13) {
              sec_1._7_1_ = 0;
              break;
            }
          }
        }
      }
      if ((sec_1._7_1_ & 1) != 0) {
        secplane_t::Normal(&local_2f0,(secplane_t *)local_220);
        TVector3<double>::XY((TVector3<double> *)local_2d8);
        TVector3<double>::operator+=(&this->Vel,(Vector2 *)local_2d8);
      }
    }
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            ((TFlags<ActorFlag,_unsigned_int> *)((long)&oldfloorz + 4),
             iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
  uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&oldfloorz + 4));
  local_401 = 0;
  if (uVar6 != 0) {
    dVar13 = (this->Vel).X;
    local_401 = 0;
    if ((dVar13 == 0.0) && (!NAN(dVar13))) {
      dVar13 = (this->Vel).Y;
      local_401 = 0;
      if ((dVar13 == 0.0) && (!NAN(dVar13))) {
        bVar4 = IsZeroDamage(this);
        local_401 = bVar4 ^ 0xff;
      }
    }
  }
  if ((local_401 & 1) != 0) {
    (this->Vel).X = 1.52587890625e-05;
  }
  this->BlockingMobj = (AActor *)0x0;
  TVector2<double>::TVector2(&local_310,(TVector2<double> *)local_120);
  local_300 = P_XYMovement(this,&local_310);
  if (((this->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
    return;
  }
  dVar13 = (this->Vel).X;
  if ((((dVar13 == 0.0) && (!NAN(dVar13))) && (dVar13 = (this->Vel).Y, dVar13 == 0.0)) &&
     (!NAN(dVar13))) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_314,iVar9 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_314);
    if (uVar6 != 0) {
      operator~((EnumType)&local_318);
      TFlags<ActorFlag2,_unsigned_int>::operator&=(&this->flags2,&local_318);
    }
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_31c,iVar9 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_31c);
    local_402 = 0;
    if (uVar6 != 0) {
      bVar4 = IsSentient(this);
      local_402 = bVar4 ^ 0xff;
    }
    if ((local_402 & 1) != 0) {
      TFlags<ActorFlag6,_unsigned_int>::operator|=(&this->flags6,MF6_ARMED);
    }
  }
  dVar13 = (this->Vel).Z;
  if (((dVar13 != 0.0) || (NAN(dVar13))) || (this->BlockingMobj != (AActor *)0x0)) {
LAB_005b025b:
    TFlags<ActorFlag2,_unsigned_int>::operator&
              (&local_320,iVar9 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
    uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_320);
    if (uVar6 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_324,
                 iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
      uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_324);
      bVar4 = false;
      if (uVar6 != 0) goto LAB_005b02c5;
    }
    else {
LAB_005b02c5:
      bVar4 = (i_compatflags & 0x10U) == 0;
    }
    if (bVar4) {
      local_18 = P_CheckOnmobj(this);
      if (local_18 == (AActor *)0x0) {
        P_ZMovement(this,local_300);
        operator~((EnumType)&local_328);
        TFlags<ActorFlag2,_unsigned_int>::operator&=(&this->flags2,&local_328);
      }
      else {
        if (this->player != (player_t *)0x0) {
          bVar4 = false;
          if ((this->Vel).Z < ::level.gravity * this->Sector->gravity * -0.01) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      ((TFlags<ActorFlag,_unsigned_int> *)((long)&deltaview + 4),
                       iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                               MF_SHOOTABLE));
            uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&deltaview + 4));
            bVar4 = uVar6 == 0;
          }
          if (bVar4) {
            PlayerLandedOnThing(this,local_18);
          }
        }
        dVar13 = Top(local_18);
        dVar14 = Z(this);
        if (dVar13 - dVar14 <= this->MaxStepHeight) {
          if ((this->player != (player_t *)0x0) && (this->player->mo == (APlayerPawn *)this)) {
            dVar13 = Top(local_18);
            dVar14 = Z(this);
            this->player->viewheight = this->player->viewheight - (dVar13 - dVar14);
            local_338 = player_t::GetDeltaViewHeight(this->player);
            pdVar1 = &this->player->deltaviewheight;
            if (*pdVar1 <= local_338 && local_338 != *pdVar1) {
              this->player->deltaviewheight = local_338;
            }
          }
          dVar13 = Top(local_18);
          SetZ(this,dVar13,true);
        }
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  (&local_33c,
                   (int)local_18 + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_33c);
        bVar4 = false;
        if (uVar6 != 0) {
          if (this->player == (player_t *)0x0) {
            if ((local_18->activationtype & 8U) != 0) {
              TFlags<ActorFlag3,_unsigned_int>::operator&
                        (&local_340,
                         iVar9 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
              uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_340);
              if (uVar6 != 0) goto LAB_005b05fc;
            }
            bVar4 = false;
            if ((local_18->activationtype & 0x10U) != 0) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_344,
                         iVar9 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                  MF_NOSECTOR|MF_SHOOTABLE));
              uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_344);
              bVar4 = false;
              if (uVar6 != 0) goto LAB_005b05fc;
            }
          }
          else {
LAB_005b05fc:
            bVar4 = local_18->lastbump < ::level.maptime;
          }
        }
        if ((bVar4) &&
           (((this->player == (player_t *)0x0 || ((this->player->cheats & 0x2000U) == 0)) &&
            (bVar4 = P_ActivateThingSpecial(local_18,this,false), bVar4)))) {
          local_18->lastbump = ::level.maptime + 0x23;
        }
        dVar13 = (this->Vel).Z;
        bVar4 = false;
        if ((dVar13 != 0.0) || (NAN(dVar13))) {
          TFlags<ActorBounceFlag,_unsigned_short>::operator&
                    (&local_346,
                     iVar9 + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                             BOUNCE_Actors));
          uVar5 = ::TFlags::operator_cast_to_unsigned_short((TFlags *)&local_346);
          bVar4 = uVar5 != 0;
        }
        if (bVar4) {
          P_BounceActor(this,local_18,true);
        }
        else {
          TFlags<ActorFlag2,_unsigned_int>::operator|=(&this->flags2,MF2_ONMOBJ);
          (this->Vel).Z = 0.0;
          Crash(this);
        }
      }
    }
    else {
      P_ZMovement(this,local_300);
    }
    uVar6 = (this->super_DThinker).super_DObject.ObjectFlags;
joined_r0x005b075d:
    if ((uVar6 & 0x20) != 0) {
      return;
    }
  }
  else {
    dVar13 = Z(this);
    if ((dVar13 != this->floorz) || (NAN(dVar13) || NAN(this->floorz))) goto LAB_005b025b;
    dVar13 = Z(this);
    if (dVar13 <= this->floorz) {
      Crash(this);
      uVar6 = (this->super_DThinker).super_DObject.ObjectFlags;
      goto joined_r0x005b075d;
    }
  }
  CheckPortalTransition(this,true);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,1);
  if ((this->player != (player_t *)0x0) && ((this->player->cheats & 0x2000U) != 0)) {
    return;
  }
  if (this->PoisonDurationReceived != 0) {
    if (this->PoisonPeriodReceived == 0) {
      local_424 = 0x23;
    }
    else {
      local_424 = this->PoisonPeriodReceived;
    }
    if (::level.time % local_424 == 0) {
      source = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->Poisoner);
      iVar7 = this->PoisonDamageReceived;
      iVar8 = FName::operator_cast_to_int(&(this->PoisonDamageTypeReceived).super_FName);
      if (iVar8 == 0) {
        FName::FName(&local_34c,NAME_Poison);
      }
      else {
        FName::FName(&local_34c,&(this->PoisonDamageTypeReceived).super_FName);
      }
      TAngle<double>::TAngle((TAngle<double> *)&stack0xfffffffffffffca8,0.0);
      P_DamageMobj(this,(AActor *)0x0,source,iVar7,&local_34c,0,(DAngle *)&stack0xfffffffffffffca8);
      this->PoisonDurationReceived = this->PoisonDurationReceived + -1;
      if (this->PoisonDurationReceived == 0) {
        this->PoisonDamageReceived = 0;
      }
    }
  }
LAB_005b0959:
  if (this->state == (FState *)0x0) {
    __assert_fail("state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x1093,"virtual void AActor::Tick()");
  }
  if (this->state == (FState *)0x0) {
    (*(this->super_DThinker).super_DObject._vptr_DObject[4])();
  }
  else {
    bVar4 = CheckNoDelay(this);
    if (bVar4) {
      UpdateRenderSectorList(this);
      if (this->tics == -1) {
        local_35c = G_SkillProperty(SKILLP_Respawn);
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_360,
                   iVar9 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                           MF5_NODROPOFF));
        uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_360);
        if (uVar6 == 0) {
          bVar4 = true;
          if (local_35c != 0) {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_364,
                       iVar9 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
            uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_364);
            bVar4 = true;
            if (uVar6 != 0) {
              TFlags<ActorFlag2,_unsigned_int>::operator&
                        ((TFlags<ActorFlag2,_unsigned_int> *)&limit,
                         iVar9 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
              uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&limit);
              bVar4 = true;
              if (uVar6 == 0) {
                TFlags<ActorFlag5,_unsigned_int>::operator&
                          (&local_36c,
                           iVar9 + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|
                                   MF5_NODROPOFF));
                uVar6 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_36c);
                bVar4 = uVar6 != 0;
              }
            }
          }
          if (bVar4) {
            return;
          }
          iVar9 = G_SkillProperty(SKILLP_RespawnLimit);
          if ((0 < iVar9) && (iVar9 <= this->skillrespawncount)) {
            return;
          }
        }
        this->movecount = this->movecount + 1;
        if (((local_35c <= this->movecount) && ((::level.time & 0x1fU) == 0)) &&
           (iVar9 = FRandom::operator()(&pr_nightmarerespawn), iVar9 < 5)) {
          P_NightmareRespawn(this);
        }
      }
      else {
        iVar9 = this->tics + -1;
        this->tics = iVar9;
        if (iVar9 < 1) {
          newstate = FState::GetNextState(this->state);
          SetState(this,newstate,false);
        }
      }
    }
  }
  return;
}

Assistant:

void AActor::Tick ()
{
	// [RH] Data for Heretic/Hexen scrolling sectors
	static const SBYTE HexenCompatSpeeds[] = {-25, 0, -10, -5, 0, 5, 10, 0, 25 };
	static const SBYTE HexenScrollies[24][2] =
	{
		{  0,  1 }, {  0,  2 }, {  0,  4 },
		{ -1,  0 }, { -2,  0 }, { -4,  0 },
		{  0, -1 }, {  0, -2 }, {  0, -4 },
		{  1,  0 }, {  2,  0 }, {  4,  0 },
		{  1,  1 }, {  2,  2 }, {  4,  4 },
		{ -1,  1 }, { -2,  2 }, { -4,  4 },
		{ -1, -1 }, { -2, -2 }, { -4, -4 },
		{  1, -1 }, {  2, -2 }, {  4, -4 }
	};

	static const BYTE HereticScrollDirs[4] = { 6, 9, 1, 4 };
	static const BYTE HereticSpeedMuls[5] = { 5, 10, 25, 30, 35 };


	AActor *onmo;

	//assert (state != NULL);
	if (state == NULL)
	{
		Printf("Actor of type %s at (%f,%f) left without a state\n", GetClass()->TypeName.GetChars(), X(), Y());
		Destroy();
		return;
	}

	// This is necessary to properly interpolate movement outside this function
	// like from an ActorMover
	ClearInterpolation();

	if (flags5 & MF5_NOINTERACTION)
	{
		// only do the minimally necessary things here to save time:
		// Check the time freezer
		// apply velocity
		// ensure that the actor is not linked into the blockmap

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			//Added by MC: Freeze mode.
			if (bglobal.freeze || level.flags2 & LEVEL2_FROZEN)
			{
				// Boss cubes shouldn't be accelerated by timefreeze
				if (flags6 & MF6_BOSSCUBE)
				{
					special2++;
				}
				return;
			}
		}

		if (!Vel.isZero() || !(flags & MF_NOBLOCKMAP))
		{
			FLinkContext ctx;
			UnlinkFromWorld(&ctx);
			flags |= MF_NOBLOCKMAP;
			SetXYZ(Vec3Offset(Vel));
			CheckPortalTransition(false);
			LinkToWorld(&ctx);
		}
	}
	else
	{
		AInventory * item = Inventory;

		// Handle powerup effects here so that the order is controlled
		// by the order in the inventory, not the order in the thinker table
		while (item != NULL && item->Owner == this)
		{
			item->DoEffect();
			item = item->Inventory;
		}

		if (flags & MF_UNMORPHED)
		{
			return;
		}

		if (!(flags5 & MF5_NOTIMEFREEZE))
		{
			// Boss cubes shouldn't be accelerated by timefreeze
			if (flags6 & MF6_BOSSCUBE)
			{
				special2++;
			}
			//Added by MC: Freeze mode.
			if (bglobal.freeze && !(player && player->Bot == NULL))
			{
				return;
			}

			// Apply freeze mode.
			if ((level.flags2 & LEVEL2_FROZEN) && (player == NULL || player->timefreezer == 0))
			{
				return;
			}
		}


		if (effects & FX_ROCKET) 
		{
			if (++smokecounter == 4)
			{
				// add some smoke behind the rocket 
				smokecounter = 0;
				AActor *th = Spawn("RocketSmokeTrail", Vec3Offset(-Vel), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}
		else if (effects & FX_GRENADE) 
		{
			if (++smokecounter == 8)
			{
				smokecounter = 0;
				DAngle moveangle = Vel.Angle();
				double xo = -moveangle.Cos() * radius * 2 + pr_rockettrail() / 64.;
				double yo = -moveangle.Sin() * radius * 2 + pr_rockettrail() / 64.;
				double zo = -Height * Vel.Z / 8. + Height * (2 / 3.);
				AActor * th = Spawn("GrenadeSmokeTrail", Vec3Offset(xo, yo, zo), ALLOW_REPLACE);
				if (th)
				{
					th->tics -= pr_rockettrail()&3;
					if (th->tics < 1) th->tics = 1;
					if (!(cl_rockettrails & 2)) th->renderflags |= RF_INVISIBLE;
				}
			}
		}

		double oldz = Z();

		// [RH] Give the pain elemental vertical friction
		// This used to be in APainElemental::Tick but in order to use
		// A_PainAttack with other monsters it has to be here
		if (flags4 & MF4_VFRICTION)
		{
			if (health >0)
			{
				if (fabs (Vel.Z) < 0.25)
				{
					Vel.Z = 0;
					flags4 &= ~MF4_VFRICTION;
				}
				else
				{
					Vel.Z *= (0xe800 / 65536.);
				}
			}
		}

		// [RH] Pulse in and out of visibility
		if (effects & FX_VISIBILITYPULSE)
		{
			if (visdir > 0)
			{
				Alpha += 1/32.;
				if (Alpha >= 1.)
				{
					Alpha = 1.;
					visdir = -1;
				}
			}
			else
			{
				Alpha -= 1/32.;
				if (Alpha <= 0.25)
				{
					Alpha = 0.25;
					visdir = 1;
				}
			}
		}
		else if (flags & MF_STEALTH)
		{
			// [RH] Fade a stealth monster in and out of visibility
			RenderStyle.Flags &= ~STYLEF_Alpha1;
			if (visdir > 0)
			{
				Alpha += 2./TICRATE;
				if (Alpha > 1.)
				{
					Alpha = 1.;
					visdir = 0;
				}
			}
			else if (visdir < 0)
			{
				Alpha -= 1.5/TICRATE;
				if (Alpha < 0)
				{
					Alpha = 0;
					visdir = 0;
				}
			}
		}

		if (bglobal.botnum && !demoplayback &&
			((flags & (MF_SPECIAL|MF_MISSILE)) || (flags3 & MF3_ISMONSTER)))
		{
			bglobal.BotTick(this);
		}

		// [RH] Consider carrying sectors here
		DVector2 cumm(0, 0);
		if ((level.Scrolls.Size() != 0 || player != NULL) && !(flags & MF_NOCLIP) && !(flags & MF_NOSECTOR))
		{
			double height, waterheight;	// killough 4/4/98: add waterheight
			const msecnode_t *node;
			int countx, county;

			// killough 3/7/98: Carry things on floor
			// killough 3/20/98: use new sector list which reflects true members
			// killough 3/27/98: fix carrier bug
			// killough 4/4/98: Underwater, carry things even w/o gravity

			// Move objects only if on floor or underwater,
			// non-floating, and clipped.

			countx = county = 0;

			for (node = touching_sectorlist; node; node = node->m_tnext)
			{
				sector_t *sec = node->m_sector;
				DVector2 scrollv;

				if (level.Scrolls.Size() > unsigned(sec-sectors))
				{
					scrollv = level.Scrolls[sec - sectors];
				}
				else
				{
					scrollv.Zero();
				}

				if (player != NULL)
				{
					int scrolltype = sec->special;

					if (scrolltype >= Scroll_North_Slow &&
						scrolltype <= Scroll_SouthWest_Fast)
					{ // Hexen scroll special
						scrolltype -= Scroll_North_Slow;
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X -= HexenCompatSpeeds[HexenScrollies[scrolltype][0]+4] * (1. / (32 * CARRYFACTOR));
							scrollv.Y += HexenCompatSpeeds[HexenScrollies[scrolltype][1]+4] * (1. / (32 * CARRYFACTOR));

						}
						else
						{
							// Use speeds that actually match the scrolling textures!
							scrollv.X -= HexenScrollies[scrolltype][0] * 0.5;
							scrollv.Y += HexenScrollies[scrolltype][1] * 0.5;
						}
					}
					else if (scrolltype >= Carry_East5 &&
							 scrolltype <= Carry_West35)
					{ // Heretic scroll special
						scrolltype -= Carry_East5;
						BYTE dir = HereticScrollDirs[scrolltype / 5];
						double carryspeed = HereticSpeedMuls[scrolltype % 5] * (1. / (32 * CARRYFACTOR));
						if (scrolltype < 5 && !(i_compatflags&COMPATF_RAVENSCROLL)) 
						{
							// Use speeds that actually match the scrolling textures!
							carryspeed = (1 << ((scrolltype % 5) + 15)) / 65536.;
						}
						scrollv.X += carryspeed * ((dir & 3) - 1);
						scrollv.Y += carryspeed * (((dir & 12) >> 2) - 1);
					}
					else if (scrolltype == dScroll_EastLavaDamage)
					{ // Special Heretic scroll special
						if (i_compatflags&COMPATF_RAVENSCROLL)
						{
							scrollv.X += 28. / (32*CARRYFACTOR);
						}
						else
						{
							// Use a speed that actually matches the scrolling texture!
							scrollv.X += 12. / (32 * CARRYFACTOR);
						}
					}
					else if (scrolltype == Scroll_StrifeCurrent)
					{ // Strife scroll special
						int anglespeed = tagManager.GetFirstSectorTag(sec) - 100;
						double carryspeed = (anglespeed % 10) / (16 * CARRYFACTOR);
						DAngle angle = ((anglespeed / 10) * 45.);
						scrollv += angle.ToVector(carryspeed);
					}
				}

				if (scrollv.isZero())
				{
					continue;
				}
				sector_t *heightsec = sec->GetHeightSec();
				if (flags & MF_NOGRAVITY && heightsec == NULL)
				{
					continue;
				}
				DVector3 pos = PosRelative(sec);
				height = sec->floorplane.ZatPoint (pos);
				double height2 = sec->floorplane.ZatPoint(this);
				if (isAbove(height))
				{
					if (heightsec == NULL)
					{
						continue;
					}

					waterheight = heightsec->floorplane.ZatPoint (pos);
					if (waterheight > height && Z() >= waterheight)
					{
						continue;
					}
				}

				cumm += scrollv;
				if (scrollv.X) countx++;
				if (scrollv.Y) county++;
			}

			// Some levels designed with Boom in mind actually want things to accelerate
			// at neighboring scrolling sector boundaries. But it is only important for
			// non-player objects.
			if (player != NULL || !(i_compatflags & COMPATF_BOOMSCROLL))
			{
				if (countx > 1)
				{
					cumm.X /= countx;
				}
				if (county > 1)
				{
					cumm.Y /= county;
				}
			}
		}

		// [RH] If standing on a steep slope, fall down it
		if ((flags & MF_SOLID) && !(flags & (MF_NOCLIP|MF_NOGRAVITY)) &&
			!(flags & MF_NOBLOCKMAP) &&
			Vel.Z <= 0 &&
			floorz == Z())
		{
			secplane_t floorplane;

			// Check 3D floors as well
			floorplane = P_FindFloorPlane(floorsector, PosAtZ(floorz));

			if (floorplane.fC() < STEEPSLOPE &&
				floorplane.ZatPoint (PosRelative(floorsector)) <= floorz)
			{
				const msecnode_t *node;
				bool dopush = true;

				if (floorplane.fC() > STEEPSLOPE*2/3)
				{
					for (node = touching_sectorlist; node; node = node->m_tnext)
					{
						const sector_t *sec = node->m_sector;
						if (sec->floorplane.fC() >= STEEPSLOPE)
						{
							if (floorplane.ZatPoint(PosRelative(node->m_sector)) >= Z() - MaxStepHeight)
							{
								dopush = false;
								break;
							}
						}
					}
				}
				if (dopush)
				{
					Vel += floorplane.Normal().XY();
				}
			}
		}

		// [RH] Missiles moving perfectly vertical need some X/Y movement, or they
		// won't hurt anything. Don't do this if damage is 0! That way, you can
		// still have missiles that go straight up and down through actors without
		// damaging anything.
		// (for backwards compatibility this must check for lack of damage function, not for zero damage!)
		if ((flags & MF_MISSILE) && Vel.X == 0 && Vel.Y == 0 && !IsZeroDamage())
		{
			Vel.X = MinVel;
		}

		// Handle X and Y velocities
		BlockingMobj = NULL;
		double oldfloorz = P_XYMovement (this, cumm);
		if (ObjectFlags & OF_EuthanizeMe)
		{ // actor was destroyed
			return;
		}
		if (Vel.X == 0 && Vel.Y == 0) // Actors at rest
		{
			if (flags2 & MF2_BLASTED)
			{ // Reset to not blasted when velocities are gone
				flags2 &= ~MF2_BLASTED;
			}
			if ((flags6 & MF6_TOUCHY) && !IsSentient())
			{ // Arm a mine which has come to rest
				flags6 |= MF6_ARMED;
			}

		}
		if (Vel.Z != 0 || BlockingMobj || Z() != floorz)
		{	// Handle Z velocity and gravity
			if (((flags2 & MF2_PASSMOBJ) || (flags & MF_SPECIAL)) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
			{
				if (!(onmo = P_CheckOnmobj (this)))
				{
					P_ZMovement (this, oldfloorz);
					flags2 &= ~MF2_ONMOBJ;
				}
				else
				{
					if (player)
					{
						if (Vel.Z < level.gravity * Sector->gravity * (-1./100)// -655.36f)
							&& !(flags&MF_NOGRAVITY))
						{
							PlayerLandedOnThing (this, onmo);
						}
					}
					if (onmo->Top() - Z() <= MaxStepHeight)
					{
						if (player && player->mo == this)
						{
							player->viewheight -= onmo->Top() - Z();
							double deltaview = player->GetDeltaViewHeight();
							if (deltaview > player->deltaviewheight)
							{
								player->deltaviewheight = deltaview;
							}
						} 
						SetZ(onmo->Top());
					}
					// Check for MF6_BUMPSPECIAL
					// By default, only players can activate things by bumping into them
					// We trigger specials as long as we are on top of it and not just when
					// we land on it. This could be considered as gravity making us continually
					// bump into it, but it also avoids having to worry about walking on to
					// something without dropping and not triggering anything.
					if ((onmo->flags6 & MF6_BUMPSPECIAL) && ((player != NULL)
						|| ((onmo->activationtype & THINGSPEC_MonsterTrigger) && (flags3 & MF3_ISMONSTER))
						|| ((onmo->activationtype & THINGSPEC_MissileTrigger) && (flags & MF_MISSILE))
						) && (level.maptime > onmo->lastbump)) // Leave the bumper enough time to go away
					{
						if (player == NULL || !(player->cheats & CF_PREDICTING))
						{
							if (P_ActivateThingSpecial(onmo, this))
								onmo->lastbump = level.maptime + TICRATE;
						}
					}
					if (Vel.Z != 0 && (BounceFlags & BOUNCE_Actors))
					{
						P_BounceActor(this, onmo, true);
					}
					else
					{
						flags2 |= MF2_ONMOBJ;
						Vel.Z = 0;
						Crash();
					}
				}
			}
			else
			{
				P_ZMovement (this, oldfloorz);
			}

			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}
		else if (Z() <= floorz)
		{
			Crash();
			if (ObjectFlags & OF_EuthanizeMe)
				return;		// actor was destroyed
		}

		CheckPortalTransition(true);

		UpdateWaterLevel ();

		// [RH] Don't advance if predicting a player
		if (player && (player->cheats & CF_PREDICTING))
		{
			return;
		}

		// Check for poison damage, but only once per PoisonPeriod tics (or once per second if none).
		if (PoisonDurationReceived && (level.time % (PoisonPeriodReceived ? PoisonPeriodReceived : TICRATE) == 0))
		{
			P_DamageMobj(this, NULL, Poisoner, PoisonDamageReceived, PoisonDamageTypeReceived ? PoisonDamageTypeReceived : (FName)NAME_Poison, 0);

			--PoisonDurationReceived;

			// Must clear damage when duration is done, otherwise it
			// could be added to with ADDITIVEPOISONDAMAGE.
			if (!PoisonDurationReceived) PoisonDamageReceived = 0;
		}
	}

	assert (state != NULL);
	if (state == NULL)
	{
		Destroy();
		return;
	}
	if (!CheckNoDelay())
		return; // freed itself
	// cycle through states, calling action functions at transitions

	UpdateRenderSectorList();

	if (tics != -1)
	{
		// [RH] Use tics <= 0 instead of == 0 so that spawnstates
		// of 0 tics work as expected.
		if (--tics <= 0)
		{
			if (!SetState(state->GetNextState()))
				return; 		// freed itself
		}
	}
	else
	{
		int respawn_monsters = G_SkillProperty(SKILLP_Respawn);
		// check for nightmare respawn
		if (!(flags5 & MF5_ALWAYSRESPAWN))
		{
			if (!respawn_monsters || !(flags3 & MF3_ISMONSTER) || (flags2 & MF2_DORMANT) || (flags5 & MF5_NEVERRESPAWN))
				return;

			int limit = G_SkillProperty (SKILLP_RespawnLimit);
			if (limit > 0 && skillrespawncount >= limit)
				return;
		}

		movecount++;

		if (movecount < respawn_monsters)
			return;

		if (level.time & 31)
			return;

		if (pr_nightmarerespawn() > 4)
			return;

		P_NightmareRespawn (this);
	}
}